

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O0

void fiat_id_GostR3410_2001_TestParamSet_from_montgomery(uint64_t *out1,uint64_t *arg1)

{
  uint64_t *in_RSI;
  uint64_t *in_RDI;
  uint64_t x76;
  uint64_t x75;
  uint64_t x74;
  uint64_t x73;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x72;
  uint64_t x71;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x70;
  uint64_t x69;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x68;
  uint64_t x67;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x66;
  uint64_t x65;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x64;
  uint64_t x63;
  uint64_t x62;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x61;
  uint64_t x60;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x59;
  uint64_t x58;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x57;
  uint64_t x56;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x55;
  uint64_t x54;
  uint64_t x53;
  uint64_t x52;
  uint64_t x51;
  uint64_t x50;
  uint64_t x49;
  uint64_t x48;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x47;
  uint64_t x46;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x45;
  uint64_t x44;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x43;
  uint64_t x42;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x41;
  uint64_t x40;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x39;
  uint64_t x38;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x37;
  uint64_t x36;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x35;
  uint64_t x34;
  uint64_t x33;
  uint64_t x32;
  uint64_t x31;
  uint64_t x30;
  uint64_t x29;
  uint64_t x28;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x27;
  uint64_t x26;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x25;
  uint64_t x24;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x23;
  uint64_t x22;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x21;
  uint64_t x20;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x19;
  uint64_t x18;
  uint64_t x17;
  uint64_t x16;
  uint64_t x15;
  uint64_t x14;
  uint64_t x13;
  uint64_t x12;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x11;
  uint64_t x10;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x9;
  uint64_t x8;
  uint64_t x7;
  uint64_t x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t local_270;
  uint64_t local_268;
  uint64_t local_260;
  uint64_t in_stack_fffffffffffffda8;
  uint64_t in_stack_fffffffffffffdb0;
  fiat_id_GostR3410_2001_TestParamSet_uint1 in_stack_fffffffffffffdbf;
  undefined7 in_stack_fffffffffffffdc0;
  fiat_id_GostR3410_2001_TestParamSet_uint1 in_stack_fffffffffffffdc7;
  uint64_t local_238;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_229;
  uint64_t local_228;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_219;
  uint64_t local_218;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_209;
  uint64_t local_208;
  uint64_t local_200;
  byte local_1f1;
  uint64_t local_1f0;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_1e1;
  uint64_t local_1e0;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_1d1;
  uint64_t local_1d0;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_1c1;
  uint64_t local_1c0;
  uint64_t local_1b8;
  uint64_t local_1b0;
  uint64_t local_1a8;
  uint64_t local_1a0;
  uint64_t local_198;
  uint64_t local_190;
  byte local_181;
  uint64_t local_180;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_171;
  uint64_t local_170;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_161;
  uint64_t local_160;
  byte local_151;
  uint64_t local_150;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_141;
  uint64_t local_140;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_131;
  uint64_t local_130;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_121;
  uint64_t local_120;
  uint64_t local_118;
  uint64_t local_110;
  uint64_t local_108;
  uint64_t local_100;
  uint64_t local_f8;
  uint64_t local_f0;
  byte local_e1;
  uint64_t local_e0;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_d1;
  uint64_t local_d0;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_c1;
  uint64_t local_c0;
  byte local_b1;
  uint64_t local_b0;
  byte local_a1;
  uint64_t local_a0;
  uint64_t local_98;
  uint64_t local_90;
  uint64_t local_88;
  uint64_t local_80;
  uint64_t local_78;
  uint64_t local_70;
  byte local_61;
  uint64_t local_60;
  byte local_51;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  uint64_t local_18;
  uint64_t *local_10;
  uint64_t *local_8;
  
  local_18 = *in_RSI;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_20,&local_28,local_18,0xdbf951d5883b2b2f);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_30,&local_38,local_20,0x8000000000000000);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_40,&local_48,local_20,0x431);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_50,&local_51,'\0',local_18,local_40);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_60,&local_61,'\0',local_51 + local_48,local_10[1]);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_70,&local_78,local_60,0xdbf951d5883b2b2f);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_80,&local_88,local_70,0x8000000000000000);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_90,&local_98,local_70,0x431);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_a0,&local_a1,'\0',local_38,local_80);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_b0,&local_b1,'\0',local_60,local_90);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_c0,&local_c1,'\0',(ulong)local_b1 + (ulong)local_61 + local_98,local_10[2]);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_d0,&local_d1,local_c1,local_30,0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_e0,&local_e1,local_d1,local_a0,0);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_f0,&local_f8,local_c0,0xdbf951d5883b2b2f);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_100,&local_108,local_f0,0x8000000000000000);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_110,&local_118,local_f0,0x431);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_120,&local_121,'\0',local_c0,local_110);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_130,&local_131,local_121,local_d0,local_118);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_140,&local_141,local_131,local_e0,0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_150,&local_151,local_141,(ulong)local_e1 + local_a1 + local_88,local_100);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_160,&local_161,'\0',local_130,local_10[3]);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_170,&local_171,local_161,local_140,0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_180,&local_181,local_171,local_150,0);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_190,&local_198,local_160,0xdbf951d5883b2b2f);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_1a0,&local_1a8,local_190,0x8000000000000000);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_1b0,&local_1b8,local_190,0x431);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_1c0,&local_1c1,'\0',local_160,local_1b0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_1d0,&local_1d1,local_1c1,local_170,local_1b8);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_1e0,&local_1e1,local_1d1,local_180,0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_1f0,&local_1f1,local_1e1,(ulong)local_181 + local_151 + local_108,local_1a0);
  local_200 = local_1f1 + local_1a8;
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&local_208,&local_209,'\0',local_1d0,0x431);
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&local_218,&local_219,local_209,local_1e0,0);
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&local_228,&local_229,local_219,local_1f0,0);
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64
            (&local_238,&stack0xfffffffffffffdc7,local_229,local_200,0x8000000000000000);
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64
            ((uint64_t *)&stack0xfffffffffffffdb8,&stack0xfffffffffffffdb7,in_stack_fffffffffffffdc7
             ,0,0);
  fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  *local_8 = in_stack_fffffffffffffda8;
  local_8[1] = local_260;
  local_8[2] = local_268;
  local_8[3] = local_270;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_TestParamSet_from_montgomery(
    uint64_t out1[4], const uint64_t arg1[4]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x9;
    uint64_t x10;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x11;
    uint64_t x12;
    uint64_t x13;
    uint64_t x14;
    uint64_t x15;
    uint64_t x16;
    uint64_t x17;
    uint64_t x18;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x19;
    uint64_t x20;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x21;
    uint64_t x22;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x23;
    uint64_t x24;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x25;
    uint64_t x26;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x27;
    uint64_t x28;
    uint64_t x29;
    uint64_t x30;
    uint64_t x31;
    uint64_t x32;
    uint64_t x33;
    uint64_t x34;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x35;
    uint64_t x36;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x37;
    uint64_t x38;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x39;
    uint64_t x40;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x41;
    uint64_t x42;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x43;
    uint64_t x44;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x45;
    uint64_t x46;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x47;
    uint64_t x48;
    uint64_t x49;
    uint64_t x50;
    uint64_t x51;
    uint64_t x52;
    uint64_t x53;
    uint64_t x54;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x55;
    uint64_t x56;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x57;
    uint64_t x58;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x59;
    uint64_t x60;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x61;
    uint64_t x62;
    uint64_t x63;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x64;
    uint64_t x65;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x66;
    uint64_t x67;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x68;
    uint64_t x69;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x70;
    uint64_t x71;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x72;
    uint64_t x73;
    uint64_t x74;
    uint64_t x75;
    uint64_t x76;
    x1 = (arg1[0]);
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x2, &x3, x1,
                                                 UINT64_C(0xdbf951d5883b2b2f));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x4, &x5, x2,
                                                 UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x6, &x7, x2, UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x8, &x9, 0x0, x1, x6);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x10, &x11, 0x0,
                                                      (x9 + x7), (arg1[1]));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x12, &x13, x10,
                                                 UINT64_C(0xdbf951d5883b2b2f));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x14, &x15, x12,
                                                 UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x16, &x17, x12,
                                                 UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x18, &x19, 0x0, x5, x14);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x20, &x21, 0x0, x10,
                                                      x16);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(
        &x22, &x23, 0x0, (((uint64_t)x21 + x11) + x17), (arg1[2]));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x24, &x25, x23, x4, 0x0);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x26, &x27, x25, x18,
                                                      0x0);
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x28, &x29, x22,
                                                 UINT64_C(0xdbf951d5883b2b2f));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x30, &x31, x28,
                                                 UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x32, &x33, x28,
                                                 UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x34, &x35, 0x0, x22,
                                                      x32);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x36, &x37, x35, x24,
                                                      x33);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x38, &x39, x37, x26,
                                                      0x0);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x40, &x41, x39,
                                                      (x27 + (x19 + x15)), x30);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x42, &x43, 0x0, x36,
                                                      (arg1[3]));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x44, &x45, x43, x38,
                                                      0x0);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x46, &x47, x45, x40,
                                                      0x0);
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x48, &x49, x42,
                                                 UINT64_C(0xdbf951d5883b2b2f));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x50, &x51, x48,
                                                 UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x52, &x53, x48,
                                                 UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x54, &x55, 0x0, x42,
                                                      x52);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x56, &x57, x55, x44,
                                                      x53);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x58, &x59, x57, x46,
                                                      0x0);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x60, &x61, x59,
                                                      (x47 + (x41 + x31)), x50);
    x62 = (x61 + x51);
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x63, &x64, 0x0, x56,
                                                       UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x65, &x66, x64, x58,
                                                       0x0);
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x67, &x68, x66, x60,
                                                       0x0);
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(
        &x69, &x70, x68, x62, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x71, &x72, x70, 0x0,
                                                       0x0);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x73, x72, x63, x56);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x74, x72, x65, x58);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x75, x72, x67, x60);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x76, x72, x69, x62);
    out1[0] = x73;
    out1[1] = x74;
    out1[2] = x75;
    out1[3] = x76;
}